

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::texparameterIuiv(NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  allocator<char> local_39;
  GLuint textureMode [2];
  string local_30;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    textureMode[0] = 0x1902;
    textureMode[1] = 0x1901;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_INVALID_ENUM is generated if target is not a valid target.",
               &local_39);
    NegativeTestContext::beginSection(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0,0x90ea,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_INVALID_ENUM is generated if pname is not a valid parameter."
               ,&local_39);
    NegativeTestContext::beginSection(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
               ,&local_39);
    NegativeTestContext::beginSection(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    textureMode[0] = 0x1100;
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x90ea,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x884c,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x884d,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x2800,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x2801,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x8e42,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x8e43,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x8e44,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x8e45,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x2802,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x2803,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0xde1,0x8072,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
               ,&local_39);
    NegativeTestContext::beginSection(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    textureMode[0] = 0;
    textureMode[1] = 0;
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x1004,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x2801,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x2800,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x2802,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x2803,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x8072,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x813a,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x813b,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x884c,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x884d,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x1004,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x2801,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x2800,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x2802,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x2803,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x8072,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x813a,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x813b,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x884c,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x884d,textureMode);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,
               "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
               ,&local_39);
    NegativeTestContext::beginSection(ctx,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    textureMode = (GLuint  [2])&DAT_100000001;
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9100,0x813c,textureMode);
    NegativeTestContext::expectError(ctx,0x502);
    glu::CallLogWrapper::glTexParameterIuiv(&ctx->super_CallLogWrapper,0x9102,0x813c,textureMode);
    NegativeTestContext::expectError(ctx,0x502);
    NegativeTestContext::endSection(ctx);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"glTexParameterIuiv is not supported.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeTextureApiTests.cpp"
             ,0x926);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void texparameterIuiv (NegativeTestContext& ctx)
{
	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
		throw tcu::NotSupportedError("glTexParameterIuiv is not supported.", DE_NULL, __FILE__, __LINE__);

	GLuint textureMode[] = { GL_DEPTH_COMPONENT, GL_STENCIL_INDEX };
	ctx.beginSection("GL_INVALID_ENUM is generated if target is not a valid target.");
	ctx.glTexParameterIuiv(0, GL_DEPTH_STENCIL_TEXTURE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not a valid parameter.");
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, 0, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	textureMode[0] = GL_DONT_CARE;
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	textureMode[0] = 0;
	textureMode[1] = 0;
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);

	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, textureMode);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	textureMode[0] = 1;
	textureMode[1] = 1;
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexParameterIuiv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, textureMode);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();
}